

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_heterogeneous_queue_basic_tests.cpp
# Opt level: O0

void density_tests::
     conc_heterogeneous_queue_basic_void_tests<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>>
               (void)

{
  bool bVar1;
  int local_ec;
  undefined1 local_e8 [8];
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  queue_1;
  undefined1 local_70 [8];
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  queue;
  
  density::
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                    *)local_70);
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          ::empty((conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                   *)local_70);
  if (!bVar1) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x48);
  }
  density::
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                     *)local_70);
  density::
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                    *)local_e8);
  density::
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
  clear((conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
         *)local_e8);
  local_ec = 1;
  density::
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
             *)local_e8,&local_ec);
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          ::empty((conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                   *)local_e8);
  if (bVar1) {
    detail::assert_failed<>
              ("!queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x50);
  }
  density::
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
  clear((conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
         *)local_e8);
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          ::empty((conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                   *)local_e8);
  if (!bVar1) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x53);
  }
  density::
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
  clear((conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
         *)local_e8);
  density::
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                     *)local_e8);
  return;
}

Assistant:

void conc_heterogeneous_queue_basic_void_tests()
    {
        {
            QUEUE queue;
            DENSITY_TEST_ASSERT(queue.empty());
        }

        {
            QUEUE queue;
            queue.clear();

            queue.push(1);
            DENSITY_TEST_ASSERT(!queue.empty());

            queue.clear();
            DENSITY_TEST_ASSERT(queue.empty());
            queue.clear();
        }
    }